

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.cpp
# Opt level: O2

void skip_leading_whitespace(sub_string *text)

{
  bool bVar1;
  char *pcVar2;
  
  while( true ) {
    bVar1 = sub_string::empty(text);
    if (bVar1) {
      return;
    }
    pcVar2 = sub_string::operator[](text,0);
    if ((*pcVar2 != ' ') && (*pcVar2 != '\t')) break;
    sub_string::advance(text,1);
  }
  return;
}

Assistant:

void skip_leading_whitespace(sub_string& text)
{
    for (;;)
    {
        if (text.empty())
            break;

        char c = text[0];
        if (!http_is_whitespace(c))
            break;

        text.advance(1);
    }
}